

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbtsub.c
# Opt level: O1

LispPTR bitblt_bitmap(LispPTR *args)

{
  uint uVar1;
  bool bVar2;
  LispPTR LVar3;
  uint uVar4;
  LispPTR LVar5;
  uint uVar6;
  int w;
  int h;
  uint uVar7;
  int iVar8;
  DLword *pDVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  uint *puVar17;
  uint uVar18;
  DLword *pDVar19;
  int y;
  uint uVar20;
  int iVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint local_e4;
  
  uVar14 = *args;
  if ((uVar14 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar14);
  }
  pDVar9 = Lisp_world + uVar14;
  uVar10 = (ulong)args[3];
  if ((args[3] & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar10);
  }
  pDVar19 = Lisp_world;
  if (((Lisp_world[uVar10 + 4] != 1) || (pDVar9[4] != 1)) || (args[8] == (uint)MERGE_atom)) {
    if ((BITBLTBITMAP_index == 0xffffffff) &&
       (BITBLTBITMAP_index = get_package_atom("\\PUNT.BITBLT.BITMAP",0x13,"INTERLISP",9,0),
       BITBLTBITMAP_index == 0xffffffff)) {
      error("BITBLTBITMAP install failed");
      return 0;
    }
    MachineState.csp = MachineState.csp + 0x1a;
    ccfuncall(BITBLTBITMAP_index,0xe,3);
    return 0x4c;
  }
  uVar14 = args[1];
  if ((uVar14 & 0xfff0000) == 0xf0000) {
    uVar14 = uVar14 | 0xffff0000;
  }
  else if ((uVar14 & 0xfff0000) == 0xe0000) {
    uVar14 = uVar14 & 0xffff;
  }
  else {
    if ((*(ushort *)((ulong)(uVar14 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
      return 0;
    }
    if ((uVar14 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar14);
    }
    uVar14 = *(uint *)(Lisp_world + uVar14);
  }
  uVar7 = args[2];
  if ((uVar7 & 0xfff0000) == 0xf0000) {
    uVar7 = uVar7 | 0xffff0000;
  }
  else if ((uVar7 & 0xfff0000) == 0xe0000) {
    uVar7 = uVar7 & 0xffff;
  }
  else {
    if ((*(ushort *)((ulong)(uVar7 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
      return 0;
    }
    if ((uVar7 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar7);
    }
    uVar7 = *(uint *)(Lisp_world + uVar7);
  }
  uVar26 = args[4];
  if ((uVar26 & 0xfff0000) == 0xf0000) {
    uVar26 = uVar26 | 0xffff0000;
  }
  else if ((uVar26 & 0xfff0000) == 0xe0000) {
    uVar26 = uVar26 & 0xffff;
  }
  else {
    if ((*(ushort *)((ulong)(uVar26 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
      return 0;
    }
    if ((uVar26 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar26);
    }
    uVar26 = *(uint *)(Lisp_world + uVar26);
  }
  uVar18 = args[5];
  if ((uVar18 & 0xfff0000) == 0xf0000) {
    uVar18 = uVar18 | 0xffff0000;
  }
  else if ((uVar18 & 0xfff0000) == 0xe0000) {
    uVar18 = uVar18 & 0xffff;
  }
  else {
    if ((*(ushort *)((ulong)(uVar18 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
      return 0;
    }
    if ((uVar18 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar18);
    }
    uVar18 = *(uint *)(Lisp_world + uVar18);
  }
  uVar20 = args[6];
  if ((uVar20 & 0xfff0000) == 0xf0000) {
    uVar20 = uVar20 | 0xffff0000;
  }
  else if ((uVar20 & 0xfff0000) == 0xe0000) {
    uVar20 = uVar20 & 0xffff;
  }
  else {
    if ((*(ushort *)((ulong)(uVar20 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
      return 0;
    }
    if ((uVar20 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n");
    }
    uVar20 = *(uint *)(Lisp_world + uVar20);
  }
  uVar22 = args[7];
  if ((uVar22 & 0xfff0000) == 0xf0000) {
    uVar22 = uVar22 | 0xffff0000;
  }
  else if ((uVar22 & 0xfff0000) == 0xe0000) {
    uVar22 = uVar22 & 0xffff;
  }
  else {
    if ((*(ushort *)((ulong)(uVar22 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
      return 0;
    }
    if ((uVar22 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar22);
    }
    uVar22 = *(uint *)(Lisp_world + uVar22);
  }
  uVar1 = args[9];
  LVar5 = args[0xb];
  uVar11 = args[0xc];
  if ((uVar11 & 0xfff0000) == 0xf0000) {
    uVar11 = uVar11 | 0xffff0000;
  }
  else if ((uVar11 & 0xfff0000) == 0xe0000) {
    uVar11 = uVar11 & 0xffff;
  }
  else {
    if ((*(ushort *)((ulong)(uVar11 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
      return 0;
    }
    if ((uVar11 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n");
    }
    uVar11 = *(uint *)(Lisp_world + uVar11);
  }
  uVar24 = args[0xd];
  if ((uVar24 & 0xfff0000) == 0xf0000) {
    uVar24 = uVar24 | 0xffff0000;
  }
  else if ((uVar24 & 0xfff0000) == 0xe0000) {
    uVar24 = uVar24 & 0xffff;
  }
  else {
    if ((*(ushort *)((ulong)(uVar24 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
      return 0;
    }
    if ((uVar24 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar24);
    }
    uVar24 = *(uint *)(Lisp_world + uVar24);
  }
  pDVar19 = pDVar19 + uVar10;
  uVar23 = (uint)pDVar19[2];
  uVar13 = (uint)pDVar19[5];
  if (LVar5 == 0) {
    uVar27 = 0;
    uVar25 = 0;
  }
  else {
    uVar28 = (uint)pDVar19[5];
    uVar23 = (uint)pDVar19[2];
    LVar3 = car(LVar5);
    if ((LVar3 & 0xfff0000) == 0xf0000) {
      uVar4 = LVar3 | 0xffff0000;
LAB_0010d850:
      uVar27 = 0;
      if (0 < (int)uVar4) {
        uVar27 = uVar4;
      }
      LVar5 = cdr(LVar5);
      LVar3 = car(LVar5);
      if ((LVar3 & 0xfff0000) == 0xf0000) {
        uVar6 = LVar3 | 0xffff0000;
      }
      else if ((LVar3 & 0xfff0000) == 0xe0000) {
        uVar6 = LVar3 & 0xffff;
      }
      else {
        uVar25 = 0;
        if ((*(ushort *)((ulong)(LVar3 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2)
        goto LAB_0010dac8;
        if ((LVar3 & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)LVar3);
        }
        uVar6 = *(uint *)(Lisp_world + LVar3);
      }
      uVar25 = 0;
      if (0 < (int)uVar6) {
        uVar25 = uVar6;
      }
      LVar5 = cdr(LVar5);
      LVar3 = car(LVar5);
      if ((LVar3 & 0xfff0000) == 0xf0000) {
        uVar12 = LVar3 | 0xffff0000;
      }
      else if ((LVar3 & 0xfff0000) == 0xe0000) {
        uVar12 = LVar3 & 0xffff;
      }
      else {
        if ((*(ushort *)((ulong)(LVar3 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2)
        goto LAB_0010dac8;
        if ((LVar3 & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n");
        }
        uVar12 = *(uint *)(Lisp_world + LVar3);
      }
      uVar13 = uVar12 + uVar4;
      if ((int)uVar28 <= (int)(uVar12 + uVar4)) {
        uVar13 = uVar28;
      }
      LVar5 = cdr(LVar5);
      LVar5 = car(LVar5);
      if ((LVar5 & 0xfff0000) == 0xf0000) {
        uVar28 = LVar5 | 0xffff0000;
      }
      else if ((LVar5 & 0xfff0000) == 0xe0000) {
        uVar28 = LVar5 & 0xffff;
      }
      else {
        if ((*(ushort *)((ulong)(LVar5 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
          bVar2 = false;
          goto LAB_0010dacd;
        }
        if ((LVar5 & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)LVar5);
        }
        uVar28 = *(uint *)(Lisp_world + LVar5);
      }
      if ((int)(uVar28 + uVar6) < (int)uVar23) {
        uVar23 = uVar28 + uVar6;
      }
      bVar2 = true;
    }
    else {
      if ((LVar3 & 0xfff0000) == 0xe0000) {
        uVar4 = LVar3 & 0xffff;
        goto LAB_0010d850;
      }
      uVar27 = 0;
      if ((*(ushort *)((ulong)(LVar3 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) == 2) {
        if ((LVar3 & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)LVar3);
        }
        uVar4 = *(uint *)(Lisp_world + LVar3);
        goto LAB_0010d850;
      }
      uVar25 = 0;
LAB_0010dac8:
      bVar2 = false;
      uVar13 = uVar28;
    }
LAB_0010dacd:
    if (!bVar2) {
      return 0;
    }
  }
  if ((int)uVar27 <= (int)uVar26) {
    uVar27 = uVar26;
  }
  uVar28 = uVar20 + uVar26;
  if ((int)uVar13 < (int)(uVar20 + uVar26)) {
    uVar28 = uVar13;
  }
  if ((int)uVar25 <= (int)uVar18) {
    uVar25 = uVar18;
  }
  uVar13 = uVar22 + uVar18;
  if ((int)uVar23 < (int)(uVar22 + uVar18)) {
    uVar13 = uVar23;
  }
  iVar21 = uVar18 - uVar7;
  iVar8 = uVar26 - uVar14;
  uVar14 = uVar27 - iVar8;
  if ((int)(uVar27 - iVar8) <= (int)uVar11) {
    uVar14 = uVar11;
  }
  uVar10 = (ulong)uVar14;
  if ((int)uVar14 < 1) {
    uVar10 = 0;
  }
  uVar14 = uVar25 - iVar21;
  if ((int)(uVar25 - iVar21) <= (int)uVar24) {
    uVar14 = uVar24;
  }
  if ((int)uVar14 < 1) {
    uVar14 = 0;
  }
  uVar7 = uVar11 + uVar20;
  if ((int)(uVar28 - iVar8) < (int)(uVar11 + uVar20)) {
    uVar7 = uVar28 - iVar8;
  }
  if ((int)(uint)pDVar9[5] <= (int)uVar7) {
    uVar7 = (uint)pDVar9[5];
  }
  uVar26 = uVar24 + uVar22;
  if ((int)(uVar13 - iVar21) < (int)(uVar24 + uVar22)) {
    uVar26 = uVar13 - iVar21;
  }
  uVar18 = (uint)pDVar9[2];
  if ((int)(uint)pDVar9[2] <= (int)uVar26) {
    uVar26 = uVar18;
  }
  uVar20 = (uint)uVar10;
  w = uVar7 - uVar20;
  if (w == 0 || (int)uVar7 < (int)uVar20) {
    return 0;
  }
  h = uVar26 - uVar14;
  if (h == 0 || (int)uVar26 < (int)uVar14) {
    return 0;
  }
  y = (uint)pDVar19[2] - (iVar21 + uVar26);
  uVar22 = uVar20 + iVar8;
  iVar21 = uVar18 - uVar26;
  uVar26 = 1;
  if (uVar1 != ERASE_atom) {
    uVar26 = (uint)(uVar1 == INVERT_atom) * 3;
  }
  uVar11 = 2;
  if (uVar1 != PAINT_atom) {
    uVar11 = uVar26;
  }
  bVar2 = true;
  if ((((pDVar9 == pDVar19) && (iVar21 <= y)) && (y <= (int)(uVar18 - uVar14))) &&
     ((iVar21 != y || ((0 < iVar8 && ((int)uVar22 < (int)uVar7)))))) {
    bVar2 = false;
  }
  if (bVar2) {
    iVar21 = iVar21 * (uint)pDVar9[3];
    uVar14 = (uint)pDVar19[3] * y + *(int *)pDVar19;
  }
  else {
    iVar21 = ((uVar18 - uVar14) + -1) * (uint)pDVar9[3];
    uVar14 = (h + y + -1) * (uint)pDVar19[3] + *(int *)pDVar19;
  }
  pDVar19 = Lisp_world + uVar14;
  ScreenLocked = 1;
  if (bVar2) {
    if ((int)uVar22 < 0) {
      uVar16 = -(ulong)(7 - uVar22 >> 3);
    }
    else {
      uVar16 = (ulong)(uVar22 >> 3);
    }
    uVar16 = uVar16 + (long)pDVar19;
    uVar14 = (uVar22 & 7) + ((uint)uVar16 & 3) * 8;
    uVar26 = (w + uVar14) - 1 & 0x1f;
    local_e4 = -1 << (~(byte)uVar26 & 0x1f) &
               (-(uint)(uVar14 == 0) | -1 << (-(char)uVar14 & 0x1fU) ^ 0xffffffffU);
    uVar10 = (long)Lisp_world + (uVar10 >> 3) + (ulong)(uint)(*(int *)pDVar9 + iVar21) * 2;
    uVar7 = (uVar20 & 7) + ((uint)uVar10 & 3) * 8;
    uVar18 = (w + uVar7) - 1 & 0x1f;
    uVar20 = uVar14 - uVar7;
  }
  else {
    uVar14 = (uVar7 + iVar8) - 1;
    if ((int)(uVar7 + iVar8) < 1) {
      uVar16 = -(ulong)(8 - (uVar7 + iVar8) >> 3);
    }
    else {
      uVar16 = (ulong)(uVar14 >> 3);
    }
    uVar16 = uVar16 + (long)pDVar19;
    uVar26 = (uVar14 & 7) + ((uint)uVar16 & 3) * 8;
    uVar14 = (uVar26 - w) + 1 & 0x1f;
    if ((int)uVar7 < 1) {
      uVar10 = -(ulong)(8 - uVar7 >> 3);
    }
    else {
      uVar10 = (ulong)(uVar7 - 1 >> 3);
    }
    uVar10 = (long)Lisp_world + uVar10 + (ulong)(uint)(*(int *)pDVar9 + iVar21) * 2;
    local_e4 = (-(uint)(uVar14 == 0) | ~(-1 << (-(char)uVar14 & 0x1fU))) &
               -1 << (~(byte)uVar26 & 0x1f);
    uVar18 = (uVar7 - 1 & 7) + ((uint)uVar10 & 3) * 8;
    uVar7 = (uVar18 - w) + 1 & 0x1f;
    uVar20 = (uVar26 - w) - (uVar18 - w);
  }
  if (h < 1) {
    if ((DisplayRegion68k <= pDVar19) && (pDVar19 <= DISP_MAX_Address)) {
      flush_display_region(uVar22,y,w,h);
    }
    ScreenLocked = 0;
    return 0x4c;
  }
  puVar17 = (uint *)(uVar16 & 0xfffffffffffffffc);
  uVar10 = uVar10 & 0xfffffffffffffffc;
  if (bVar2) {
    if ((uVar14 < uVar7) && (0x20 < (int)(uVar7 + w))) {
      lVar15 = uVar10 + 8;
    }
    else {
      lVar15 = uVar10 + 4;
    }
    if (0x20 < (int)(uVar14 + w)) {
      LVar5 = (*(code *)(&DAT_0014377c + *(int *)(&DAT_0014377c + (ulong)uVar11 * 4)))
                        (puVar17,lVar15,&DAT_0014377c + *(int *)(&DAT_0014377c + (ulong)uVar11 * 4),
                         *puVar17);
      return LVar5;
    }
    goto LAB_0010e8e6;
  }
  if (uVar18 < uVar26) {
    if ((int)(uVar14 + 1) < (int)(uVar7 + w)) {
      lVar15 = uVar10 - 8;
    }
    else {
      if (uVar26 <= uVar18) goto LAB_0010e068;
      lVar15 = uVar10 - 4;
    }
  }
  else {
LAB_0010e068:
    lVar15 = uVar10 - 4;
  }
  if (0x20 < (int)(uVar14 + w)) {
    LVar5 = (*(code *)(&DAT_0014372c + *(int *)(&DAT_0014372c + (ulong)uVar11 * 4)))
                      (puVar17,lVar15,*puVar17,(ulong)uVar11,uVar18,uVar20 & 0x1f);
    return LVar5;
  }
LAB_0010e8e6:
  LVar5 = (*(code *)(&DAT_001437cc + *(int *)(&DAT_001437cc + (ulong)uVar11 * 4)))
                    (puVar17,~local_e4 & *puVar17);
  return LVar5;
}

Assistant:

LispPTR bitblt_bitmap(LispPTR *args) {
  BITMAP *SourceBitmap, *DestBitmap;
  int sleft, sbottom, dleft, dbottom, width, height, clipleft, clipbottom;
  LispPTR clipreg;
  int stodx, stody, right, top, destbits, sourcebits, left, bottom;
  LispPTR sourcetype, operation, texture;
  DLword *srcbase, *dstbase;
  int dlx, dty, slx, sty, srcbpl, dstbpl, op, src_comp, backwardflg = 0, displayflg = 0;

#ifdef INIT
  init_kbd_startup;
#endif

  /* Get arguments  and check the possibilities of PUNT */
  SourceBitmap = (BITMAP *)NativeAligned4FromLAddr(args[0]);
  DestBitmap = (BITMAP *)NativeAligned4FromLAddr(args[3]);
  /* It does not handle COLOR ..... maybe later */
  destbits = DestBitmap->bmbitperpixel;
  sourcebits = SourceBitmap->bmbitperpixel;
  if ((destbits != 1) || (sourcebits != 1)) {
    PUNT_TO_BITBLTBITMAP;
  }
  sourcetype = args[8];
  /* sourcetype == MERGE_atom case must be handled in Lisp function \\PUNT.BITBLT.BITMAP */
  if (sourcetype == MERGE_atom) { PUNT_TO_BITBLTBITMAP; }

  N_GETNUMBER(args[1], sleft, bad_arg);
  N_GETNUMBER(args[2], sbottom, bad_arg);
  N_GETNUMBER(args[4], dleft, bad_arg);
  N_GETNUMBER(args[5], dbottom, bad_arg);
  N_GETNUMBER(args[6], width, bad_arg);
  N_GETNUMBER(args[7], height, bad_arg);
  operation = args[9];
  texture = args[10];
  clipreg = args[11];
  N_GETNUMBER(args[12], clipleft, bad_arg);
  N_GETNUMBER(args[13], clipbottom, bad_arg);

  left = bottom = 0;
  top = DestBitmap->bmheight;
  right = DestBitmap->bmwidth;

  if (clipreg != NIL_PTR) {
    /* clip the BITBLT using the clipping region supplied */
    LispPTR clipvalue;
    int temp, cr_left, cr_bot;

    clipvalue = car(clipreg);
    N_GETNUMBER(clipvalue, cr_left, bad_arg);
    left = max(left, cr_left);

    clipreg = cdr(clipreg);
    clipvalue = car(clipreg);
    N_GETNUMBER(clipvalue, cr_bot, bad_arg);
    bottom = max(bottom, cr_bot);

    clipreg = cdr(clipreg);
    clipvalue = car(clipreg);
    N_GETNUMBER(clipvalue, temp, bad_arg);
    right = min(right, cr_left + temp);

    clipreg = cdr(clipreg);
    clipvalue = car(clipreg);
    N_GETNUMBER(clipvalue, temp, bad_arg);
    top = min(top, cr_bot + temp);
  }

  left = max(left, dleft);
  right = min(right, dleft + width);
  bottom = max(bottom, dbottom);
  top = min(top, dbottom + height);
  stody = dbottom - sbottom;
  stodx = dleft - sleft;

  {
    int temp;
    left = max(clipleft, max(0, left - stodx));
    bottom = max(clipbottom, max(0, bottom - stody));
    temp = SourceBitmap->bmwidth;
    right = min(temp, min(right - stodx, clipleft + width));
    temp = SourceBitmap->bmheight;
    top = min(temp, min(top - stody, clipbottom + height));
  }

  if ((right <= left) || (top <= bottom)) return (NIL);

  /*** PUT SOURCETYPE MERGE special code HERE ***/
  /**** See above, earlier in this code check sourcetype and punting. *****/
  /**** sourcebits CANNOT be unequal to destbits from earlier check */

  if (sourcebits != destbits) {
    /* DBPRINT(("BITBLT between bitmaps of different sizes, unimplemented.")); */
      return NIL;
  }
  /* if not 1-bit-per-pixel adjust limits by pixel size */
  switch (sourcebits) {
  case 1:
      break;
  case 4:
      left = left * 4;
      right = right * 4;
      stodx = stodx * 4;
      /* Put color texture merge case here */
      break;

  case 8:
      left = left * 8;
      right = right * 8;
      stodx = stodx * 8;
      /* Put color texture merge case here */
      break;

  case 24:
      left = left * 24;
      right = right * 24;
      stodx = stodx * 24;
      /* Put color texture merge case here */
      break;
  }

  height = top - bottom;
  width = right - left;
  dty = DestBitmap->bmheight - (top + stody);
  dlx = left + stodx;
  sty = SourceBitmap->bmheight - top;
  slx = left;

  /*** Stolen from bitbltsub, to avoid the call overhead: ***/
  src_comp = bbsrc_type(sourcetype, operation);
  op = bbop(sourcetype, operation);

  dstbpl = DestBitmap->bmrasterwidth << 4;

  /* Sourcetype guaranteed not to be TEXTURE by BITBLT fn */
  srcbpl = SourceBitmap->bmrasterwidth << 4;

  /* compute flags */
  if (SourceBitmap != DestBitmap)
    ;
  else if (sty > dty)
    ;
  else if (dty > (sty + height))
    ;
  else if ((sty != dty) || ((slx < dlx) && (dlx < (slx + width))))
    backwardflg = T;

  if (backwardflg) {
    srcbase = (DLword *)NativeAligned2FromLAddr(
        ADDBASE(SourceBitmap->bmbase, SourceBitmap->bmrasterwidth * (sty + height - 1)));
    dstbase = (DLword *)NativeAligned2FromLAddr(
        ADDBASE(DestBitmap->bmbase, DestBitmap->bmrasterwidth * (dty + height - 1)));
    srcbpl = 0 - srcbpl;
    dstbpl = 0 - dstbpl;
  } else {
    srcbase = (DLword *)NativeAligned2FromLAddr(
        ADDBASE(SourceBitmap->bmbase, SourceBitmap->bmrasterwidth * sty));
    dstbase =
        (DLword *)NativeAligned2FromLAddr(ADDBASE(DestBitmap->bmbase, DestBitmap->bmrasterwidth * dty));
  }

  displayflg = n_new_cursorin(srcbase, slx, sty, width, height);

do_it_now:
  LOCKSCREEN;

#ifdef REALCURSOR
  displayflg |= n_new_cursorin(dstbase, dlx, dty, width, height);
  if (displayflg) HideCursor;
#endif /*  REALCURSOR */

#ifdef NEWBITBLT
  bitblt(srcbase, dstbase, slx, dlx, width, height, srcbpl, dstbpl, backwardflg, src_comp, op, 0, 0,
         0);
#else
#define gray 0
#define dx dlx
#define sx slx
#define w width
#define h height
#define curr_gray_line dx
#define num_gray 0
  new_bitblt_code;
#undef gray
#undef dx
#undef sx
#undef w
#undef h
#undef curr_gray_line
#undef num_gray
#endif

#ifdef DISPLAYBUFFER
#ifdef COLOR
  if (MonoOrColor == MONO_SCREEN)
#endif /* COLOR */

    /* Copy the changed section of display bank to the frame buffer */
    if (in_display_segment(dstbase)) {
      /*      DBPRINT(("bltsub: x %d, y %d, w %d, h %d.\n",dlx, dty, width,height));*/
      flush_display_region(dlx, dty, width, height);
    }
#endif

#ifdef XWINDOW
  if (in_display_segment(dstbase)) flush_display_region(dlx, dty, width, height);
#endif /* XWINDOW */

#ifdef SDL
  if (in_display_segment(dstbase)) flush_display_region(dlx, dty, width, height);
#endif /* SDL */

#ifdef DOS
  /* Copy the changed section of display bank to the frame buffer */
  if (in_display_segment(dstbase)) {
    /*      DBPRINT(("bltsub: x %d, y %d, w %d, h %d.\n",dx, dty, w,h)); */
    flush_display_region(dlx, dty, width, height);
  }
#endif /* DOS */

#ifdef REALCURSOR
  if (displayflg) ShowCursor;
#endif /* REALCURSOR */

  UNLOCKSCREEN;

  return (ATOM_T);

bad_arg:
  return (NIL);
}